

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_start_key_creation
          (psa_key_creation_method_t method,psa_key_attributes_t *attributes,
          psa_key_handle_t *handle,psa_key_slot_t **p_slot,psa_se_drv_table_entry_t **p_drv)

{
  psa_key_slot_t *ppVar1;
  psa_key_bits_t pVar2;
  psa_key_lifetime_t pVar3;
  psa_key_usage_t pVar4;
  psa_algorithm_t pVar5;
  undefined2 uVar6;
  psa_key_slot_t *slot;
  psa_status_t status;
  psa_se_drv_table_entry_t **p_drv_local;
  psa_key_slot_t **p_slot_local;
  psa_key_handle_t *handle_local;
  psa_key_attributes_t *attributes_local;
  psa_key_creation_method_t method_local;
  
  *p_drv = (psa_se_drv_table_entry_t *)0x0;
  attributes_local._4_4_ = psa_validate_key_attributes(attributes,p_drv);
  if ((attributes_local._4_4_ == 0) &&
     (attributes_local._4_4_ = psa_get_empty_key_slot(handle,p_slot), attributes_local._4_4_ == 0))
  {
    ppVar1 = *p_slot;
    pVar2 = (attributes->core).bits;
    pVar3 = (attributes->core).lifetime;
    (ppVar1->attr).type = (attributes->core).type;
    (ppVar1->attr).bits = pVar2;
    (ppVar1->attr).lifetime = pVar3;
    pVar4 = (attributes->core).policy.usage;
    (ppVar1->attr).id = (attributes->core).id;
    (ppVar1->attr).policy.usage = pVar4;
    pVar5 = (attributes->core).policy.alg2;
    (ppVar1->attr).policy.alg = (attributes->core).policy.alg;
    (ppVar1->attr).policy.alg2 = pVar5;
    uVar6 = *(undefined2 *)&(attributes->core).field_0x1a;
    (ppVar1->attr).flags = (attributes->core).flags;
    *(undefined2 *)&(ppVar1->attr).field_0x1a = uVar6;
    (ppVar1->attr).flags = (ppVar1->attr).flags & 0xfffe;
  }
  return attributes_local._4_4_;
}

Assistant:

static psa_status_t psa_start_key_creation(
    psa_key_creation_method_t method,
    const psa_key_attributes_t *attributes,
    psa_key_handle_t *handle,
    psa_key_slot_t **p_slot,
    psa_se_drv_table_entry_t **p_drv )
{
    psa_status_t status;
    psa_key_slot_t *slot;

    (void) method;
    *p_drv = NULL;

    status = psa_validate_key_attributes( attributes, p_drv );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_get_empty_key_slot( handle, p_slot );
    if( status != PSA_SUCCESS )
        return( status );
    slot = *p_slot;

    /* We're storing the declared bit-size of the key. It's up to each
     * creation mechanism to verify that this information is correct.
     * It's automatically correct for mechanisms that use the bit-size as
     * an input (generate, device) but not for those where the bit-size
     * is optional (import, copy). */

    slot->attr = attributes->core;

    /* Erase external-only flags from the internal copy. To access
     * external-only flags, query `attributes`. Thanks to the check
     * in psa_validate_key_attributes(), this leaves the dual-use
     * flags and any internal flag that psa_get_empty_key_slot()
     * may have set. */
    slot->attr.flags &= ~MBEDTLS_PSA_KA_MASK_EXTERNAL_ONLY;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    /* For a key in a secure element, we need to do three things
     * when creating or registering a key:
     * create the key file in internal storage, create the
     * key inside the secure element, and update the driver's
     * persistent data. Start a transaction that will encompass these
     * three actions. */
    /* The first thing to do is to find a slot number for the new key.
     * We save the slot number in persistent storage as part of the
     * transaction data. It will be needed to recover if the power
     * fails during the key creation process, to clean up on the secure
     * element side after restarting. Obtaining a slot number from the
     * secure element driver updates its persistent state, but we do not yet
     * save the driver's persistent state, so that if the power fails,
     * we can roll back to a state where the key doesn't exist. */
    if( *p_drv != NULL )
    {
        status = psa_find_se_slot_for_key( attributes, method, *p_drv,
                                           &slot->data.se.slot_number );
        if( status != PSA_SUCCESS )
            return( status );
        psa_crypto_prepare_transaction( PSA_CRYPTO_TRANSACTION_CREATE_KEY );
        psa_crypto_transaction.key.lifetime = slot->attr.lifetime;
        psa_crypto_transaction.key.slot = slot->data.se.slot_number;
        psa_crypto_transaction.key.id = slot->attr.id;
        status = psa_crypto_save_transaction( );
        if( status != PSA_SUCCESS )
        {
            (void) psa_crypto_stop_transaction( );
            return( status );
        }
    }

    if( *p_drv == NULL && method == PSA_KEY_CREATION_REGISTER )
    {
        /* Key registration only makes sense with a secure element. */
        return( PSA_ERROR_INVALID_ARGUMENT );
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    return( status );
}